

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::anon_unknown_36::HttpClientImpl::watchForClose(HttpClientImpl *this)

{
  PromiseArena *pPVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 node;
  undefined1 auVar2 [8];
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> node_00;
  OwnPromiseNode node_01;
  void *pvVar3;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode intermediate;
  undefined1 local_58 [8];
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> local_50;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_48;
  OwnPromiseNode local_40;
  undefined1 local_38 [16];
  size_t local_28;
  
  HttpInputStreamImpl::awaitNextMessage((HttpInputStreamImpl *)local_58);
  auVar2 = local_58;
  pPVar1 = *(PromiseArena **)((long)local_58 + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_58 - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_58,
               kj::_::
               SimpleTransformPromiseNode<bool,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5705:15)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_0061b2c8;
    *(HttpClientImpl **)((long)pvVar3 + 0x3f8) = this;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    *(PromiseArena **)((long)local_58 + 8) = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)((long)local_58 + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_58,
               kj::_::
               SimpleTransformPromiseNode<bool,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5705:15)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)auVar2 + -0x28) = &PTR_destroy_0061b2c8;
    *(HttpClientImpl **)((long)auVar2 + -8) = this;
    ((PromiseArenaMember *)((long)auVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_38._0_8_ = &DAT_0048a171;
  local_38._8_8_ = &DAT_0048a1d0;
  local_28 = (size_t)&DAT_4c0000058b;
  local_40.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,&local_40,(SourceLocation *)local_38);
  node_01.ptr = local_40.ptr;
  if ((TransformPromiseNodeBase *)local_40.ptr != (TransformPromiseNodeBase *)0x0) {
    local_40.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node_01.ptr)->super_PromiseArenaMember);
  }
  local_38._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_38._8_8_ = "watchForClose";
  local_28 = 0x1800001648;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_48.value,(OwnPromiseNode *)&local_50,
             (SourceLocation *)local_38);
  if ((this->closeWatcherTask).ptr.isSet == true) {
    (this->closeWatcherTask).ptr.isSet = false;
    node = (this->closeWatcherTask).ptr.field_1;
    if (node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
      (this->closeWatcherTask).ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  node_00.currentWrapper.ptr = local_50.currentWrapper.ptr;
  (this->closeWatcherTask).ptr.field_1 = local_48;
  local_48 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
  (this->closeWatcherTask).ptr.isSet = true;
  if (local_50.currentWrapper.ptr != (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0)
  {
    local_50.currentWrapper.ptr =
         (Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>)
         (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00.currentWrapper.ptr);
  }
  auVar2 = local_58;
  if (local_58 != (undefined1  [8])0x0) {
    local_58 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar2);
  }
  return;
}

Assistant:

void watchForClose() {
    closeWatcherTask = httpInput.awaitNextMessage()
        .then([this](bool hasData) -> kj::Promise<void> {
      if (hasData) {
        // Uhh... The server sent some data before we asked for anything. Perhaps due to properties
        // of this application, the server somehow already knows what the next request will be, and
        // it is trying to optimize. Or maybe this is some sort of test and the server is just
        // replaying a script. In any case, we will humor it -- leave the data in the buffer and
        // let it become the response to the next request.
        return kj::READY_NOW;
      } else {
        // EOF -- server disconnected.
        closed = true;
        if (httpOutput.isInBody()) {
          // Huh, the application is still sending a request. We should let it finish. We do not
          // need to proactively free the socket in this case because we know that we're not
          // sitting in a reusable connection pool, because we know the application is still
          // actively using the connection.
          return kj::READY_NOW;
        } else {
          return httpOutput.flush().then([this]() {
            // We might be sitting in NetworkAddressHttpClient's `availableClients` pool. We don't
            // have a way to notify it to remove this client from the pool; instead, when it tries
            // to pull this client from the pool later, it will notice the client is dead and will
            // discard it then. But, we would like to avoid holding on to a socket forever. So,
            // destroy the socket now.
            // TODO(cleanup): Maybe we should arrange to proactively remove ourselves? Seems
            //   like the code will be awkward.
            ownStream = nullptr;
          });
        }
      }
    }).eagerlyEvaluate(nullptr);
  }